

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFPageObjectHelper::flattenRotation(QPDFPageObjectHelper *this,QPDFAcroFormDocumentHelper *afdh)

{
  BaseHandle *pBVar1;
  _Rb_tree_header *this_00;
  double dVar2;
  double dVar3;
  pointer pQVar4;
  bool bVar5;
  int iVar6;
  string *data;
  double *pdVar7;
  long lVar8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer key;
  double dVar10;
  double dVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  longlong in_stack_fffffffffffffd28;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  allocator<char> local_26d;
  int local_26c;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  Rectangle media_rect;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  QPDFObjectHandle annots;
  QPDFObjectHandle rotate_obj;
  QPDFObjectHandle mediabox;
  QPDFObjectHandle rotate_oh;
  shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
  QPDFObjectHandle local_1a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_190;
  QPDFObjectHandle local_180;
  QPDFObjectHandle local_170;
  string cm_str;
  Rectangle rect;
  double local_120;
  double local_118 [3];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  boxes;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  QPDFFormFieldObjectHelper local_68;
  
  pBVar1 = &(this->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&old_fields,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rect,"QPDFPageObjectHelper::flattenRotation called with a direct object",
             (allocator<char> *)&media_rect);
  data = (string *)QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&old_fields,(string *)&rect);
  std::__cxx11::string::~string((string *)&rect);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &old_fields._M_t._M_impl.super__Rb_tree_header);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&old_fields,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rect,"/Rotate",(allocator<char> *)&media_rect);
  QPDFObjectHandle::getKey(&rotate_oh,(string *)&old_fields);
  std::__cxx11::string::~string((string *)&rect);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &old_fields._M_t._M_impl.super__Rb_tree_header);
  bVar5 = QPDFObjectHandle::isInteger(&rotate_oh);
  if ((!bVar5) ||
     (((iVar6 = QPDFObjectHandle::getIntValueAsInt(&rotate_oh), iVar6 != 0x5a && (iVar6 != 0x10e))
      && (iVar6 != 0xb4)))) goto LAB_001aacf6;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&old_fields,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rect,"/MediaBox",(allocator<char> *)&media_rect);
  QPDFObjectHandle::getKey(&mediabox,(string *)&old_fields);
  std::__cxx11::string::~string((string *)&rect);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &old_fields._M_t._M_impl.super__Rb_tree_header);
  bVar5 = QPDFObjectHandle::isRectangle(&mediabox);
  if (bVar5) {
    QPDFObjectHandle::getArrayAsRectangle(&media_rect,&mediabox);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rect,"/MediaBox",(allocator<char> *)&old_fields);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"/CropBox",(allocator<char> *)&cm_str);
    std::__cxx11::string::string<std::allocator<char>>
              (local_100,"/BleedBox",(allocator<char> *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              (local_e0,"/TrimBox",(allocator<char> *)&new_annots);
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,"/ArtBox",(allocator<char> *)&new_fields);
    __l._M_len = 5;
    __l._M_array = (iterator)&rect;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&boxes,__l,(allocator_type *)&rotate_obj);
    lVar8 = 0x80;
    local_26c = iVar6;
    do {
      std::__cxx11::string::~string((string *)((long)&rect.llx + lVar8));
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x20);
    for (key = boxes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        key != boxes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; key = key + 1) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&rect,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&cm_str,(string *)&rect);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rect.lly);
      bVar5 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)&cm_str);
      if (bVar5) {
        QPDFObjectHandle::getArrayAsRectangle(&rect,(QPDFObjectHandle *)&cm_str);
        old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        old_fields._M_t._M_impl._0_8_ = 0;
        old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        old_fields._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        dVar10 = media_rect.urx - rect.urx;
        dVar11 = rect.lly - media_rect.lly;
        dVar2 = media_rect.ury - rect.ury;
        dVar3 = rect.llx - media_rect.llx;
        if (local_26c == 0x5a) {
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = media_rect.llx + dVar10;
          old_fields._M_t._M_impl._0_8_ = media_rect.lly + dVar11;
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(media_rect.ury - dVar2);
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)(media_rect.urx - dVar3);
        }
        else if (local_26c == 0xb4) {
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(media_rect.urx - dVar3);
          old_fields._M_t._M_impl._0_8_ = media_rect.llx + dVar10;
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = media_rect.lly + dVar2;
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)(media_rect.ury - dVar11);
        }
        else if (local_26c == 0x10e) {
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(media_rect.ury - dVar11);
          old_fields._M_t._M_impl._0_8_ = media_rect.lly + dVar2;
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = media_rect.llx + dVar3;
          old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)(media_rect.urx - dVar10);
        }
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_290,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
        QPDFObjectHandle::newFromRectangle((Rectangle *)&new_annots);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)&local_290,key,(QPDFObjectHandle *)&new_annots);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &new_annots.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_290._M_string_length);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cm_str._M_string_length);
    }
    QPDFMatrix::QPDFMatrix((QPDFMatrix *)&rect,0.0,0.0,0.0,0.0,0.0,0.0);
    if (local_26c == 0x5a) {
      rect.lly = -1.0;
      rect.urx = 1.0;
      dVar2 = media_rect.urx + media_rect.llx;
LAB_001aa7f5:
      pdVar7 = local_118;
LAB_001aa7fd:
      *pdVar7 = dVar2;
    }
    else {
      if (local_26c == 0xb4) {
        rect.llx = -1.0;
        rect.ury = -1.0;
        local_120 = media_rect.urx + media_rect.llx;
        dVar2 = media_rect.ury + media_rect.lly;
        goto LAB_001aa7f5;
      }
      if (local_26c == 0x10e) {
        rect.lly = 1.0;
        rect.urx = -1.0;
        dVar2 = media_rect.ury + media_rect.lly;
        pdVar7 = &local_120;
        goto LAB_001aa7fd;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"q\n",(allocator<char> *)&new_fields);
    QPDFMatrix::unparse_abi_cxx11_((string *)&new_annots,(QPDFMatrix *)&rect);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&old_fields,
                   &local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_annots)
    ;
    std::operator+(&cm_str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &old_fields," cm\n");
    std::__cxx11::string::~string((string *)&old_fields);
    std::__cxx11::string::~string((string *)&new_annots);
    std::__cxx11::string::~string((string *)&local_290);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&old_fields,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    QPDFObjectHandle::newStream((QPDF *)&local_170,data);
    QPDFObjectHandle::addPageContents((QPDFObjectHandle *)&old_fields,&local_170,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_170.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this_00 = &old_fields._M_t._M_impl.super__Rb_tree_header;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_290,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&old_fields,"\nQ\n",(allocator<char> *)&new_annots);
    QPDF::newStream((QPDF *)&local_180,data);
    QPDFObjectHandle::addPageContents((QPDFObjectHandle *)&local_290,&local_180,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_180.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&old_fields);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_290._M_string_length);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_290,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&old_fields,"/Rotate",(allocator<char> *)&new_annots);
    QPDFObjectHandle::removeKey((QPDFObjectHandle *)&local_290,(string *)&old_fields);
    std::__cxx11::string::~string((string *)&old_fields);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_290._M_string_length);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&old_fields,"/Rotate",(allocator<char> *)&local_290);
    getAttribute((QPDFPageObjectHelper *)&rotate_obj,(string *)this,SUB81(&old_fields,0));
    std::__cxx11::string::~string((string *)&old_fields);
    bVar5 = QPDFObjectHandle::isNull(&rotate_obj);
    if (!bVar5) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_290,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&old_fields,"/Rotate",(allocator<char> *)&new_fields);
      QPDFObjectHandle::newInteger(in_stack_fffffffffffffd28);
      QPDFObjectHandle::replaceKey
                ((QPDFObjectHandle *)&local_290,(string *)&old_fields,
                 (QPDFObjectHandle *)&new_annots);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)&old_fields);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_290._M_string_length);
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_290,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&old_fields,"/Annots",(allocator<char> *)&new_annots);
    QPDFObjectHandle::getKey(&annots,&local_290);
    std::__cxx11::string::~string((string *)&old_fields);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_290._M_string_length);
    bVar5 = QPDFObjectHandle::isArray(&annots);
    if (bVar5) {
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           old_fields._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &this_00->_M_header;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &this_00->_M_header;
      if (afdh == (QPDFAcroFormDocumentHelper *)0x0) {
        std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&local_290);
        std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&afdhph.
                    super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_290);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_290._M_string_length);
        afdh = afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      }
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_88,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&annots);
      QPDFAcroFormDocumentHelper::transformAnnotations
                (afdh,(QPDFObjectHandle *)&local_88,&new_annots,&new_fields,&old_fields,
                 (QPDFMatrix *)&rect,(QPDF *)0x0,(QPDFAcroFormDocumentHelper *)0x0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
      QPDFAcroFormDocumentHelper::removeFormFields(afdh,&old_fields);
      pQVar4 = new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (p_Var9 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                    new_fields.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start;
          p_Var9 != (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pQVar4;
          p_Var9 = p_Var9 + 1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_78,p_Var9);
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                  (&local_68,(QPDFObjectHandle *)&local_78);
        QPDFAcroFormDocumentHelper::addFormField(afdh,&local_68);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      }
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_190,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"/Annots",&local_26d);
      QPDFObjectHandle::newArray(&local_1a0,&new_annots);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_190,&local_290,&local_1a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1a0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&local_290);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&old_fields._M_t);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_fields);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_annots);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&annots.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rotate_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&cm_str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&boxes);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mediabox.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001aacf6:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rotate_oh.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFPageObjectHelper::flattenRotation(QPDFAcroFormDocumentHelper* afdh)
{
    QPDF& qpdf = oh().getQPDF("QPDFPageObjectHelper::flattenRotation called with a direct object");
    auto rotate_oh = oh().getKey("/Rotate");
    int rotate = 0;
    if (rotate_oh.isInteger()) {
        rotate = rotate_oh.getIntValueAsInt();
    }
    if (!((rotate == 90) || (rotate == 180) || (rotate == 270))) {
        return;
    }
    auto mediabox = oh().getKey("/MediaBox");
    if (!mediabox.isRectangle()) {
        return;
    }
    auto media_rect = mediabox.getArrayAsRectangle();

    std::vector<std::string> boxes = {
        "/MediaBox",
        "/CropBox",
        "/BleedBox",
        "/TrimBox",
        "/ArtBox",
    };
    for (auto const& boxkey: boxes) {
        auto box = oh().getKey(boxkey);
        if (!box.isRectangle()) {
            continue;
        }
        auto rect = box.getArrayAsRectangle();
        decltype(rect) new_rect;

        // How far are the edges of our rectangle from the edges of the media box?
        auto left_x = rect.llx - media_rect.llx;
        auto right_x = media_rect.urx - rect.urx;
        auto bottom_y = rect.lly - media_rect.lly;
        auto top_y = media_rect.ury - rect.ury;

        // Rotating the page 180 degrees does not change /MediaBox. Rotating 90 or 270 degrees
        // reverses llx and lly and also reverse urx and ury. For all the other boxes, we want the
        // corners to be the correct distance away from the corners of the mediabox.
        switch (rotate) {
        case 90:
            new_rect.llx = media_rect.lly + bottom_y;
            new_rect.urx = media_rect.ury - top_y;
            new_rect.lly = media_rect.llx + right_x;
            new_rect.ury = media_rect.urx - left_x;
            break;

        case 180:
            new_rect.llx = media_rect.llx + right_x;
            new_rect.urx = media_rect.urx - left_x;
            new_rect.lly = media_rect.lly + top_y;
            new_rect.ury = media_rect.ury - bottom_y;
            break;

        case 270:
            new_rect.llx = media_rect.lly + top_y;
            new_rect.urx = media_rect.ury - bottom_y;
            new_rect.lly = media_rect.llx + left_x;
            new_rect.ury = media_rect.urx - right_x;
            break;

        default:
            // ignore
            break;
        }

        oh().replaceKey(boxkey, QPDFObjectHandle::newFromRectangle(new_rect));
    }

    // When we rotate the page, pivot about the point 0, 0 and then translate so the page is visible
    // with the origin point being the same offset from the lower left corner of the media box.
    // These calculations have been verified empirically with various
    // PDF readers.
    QPDFMatrix cm(0, 0, 0, 0, 0, 0);
    switch (rotate) {
    case 90:
        cm.b = -1;
        cm.c = 1;
        cm.f = media_rect.urx + media_rect.llx;
        break;

    case 180:
        cm.a = -1;
        cm.d = -1;
        cm.e = media_rect.urx + media_rect.llx;
        cm.f = media_rect.ury + media_rect.lly;
        break;

    case 270:
        cm.b = 1;
        cm.c = -1;
        cm.e = media_rect.ury + media_rect.lly;
        break;

    default:
        break;
    }
    std::string cm_str = std::string("q\n") + cm.unparse() + " cm\n";
    oh().addPageContents(QPDFObjectHandle::newStream(&qpdf, cm_str), true);
    oh().addPageContents(qpdf.newStream("\nQ\n"), false);
    oh().removeKey("/Rotate");
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    if (!rotate_obj.isNull()) {
        QTC::TC("qpdf", "QPDFPageObjectHelper flatten inherit rotate");
        oh().replaceKey("/Rotate", QPDFObjectHandle::newInteger(0));
    }

    QPDFObjectHandle annots = oh().getKey("/Annots");
    if (annots.isArray()) {
        std::vector<QPDFObjectHandle> new_annots;
        std::vector<QPDFObjectHandle> new_fields;
        std::set<QPDFObjGen> old_fields;
        std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
        if (!afdh) {
            afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(qpdf);
            afdh = afdhph.get();
        }
        afdh->transformAnnotations(annots, new_annots, new_fields, old_fields, cm);
        afdh->removeFormFields(old_fields);
        for (auto const& f: new_fields) {
            afdh->addFormField(QPDFFormFieldObjectHelper(f));
        }
        oh().replaceKey("/Annots", QPDFObjectHandle::newArray(new_annots));
    }
}